

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O2

REF_STATUS
ref_phys_yplus_metric_reference_length
          (REF_GRID ref_grid,REF_DBL *metric,REF_DBL mach,REF_DBL re,REF_DBL temperature,
          REF_DBL target,REF_DBL reference_length,REF_INT ldim,REF_DBL *field,REF_DICT ref_dict_bcs)

{
  int iVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_CELL ref_cell;
  REF_EDGE ref_edge;
  REF_GRID pRVar3;
  REF_STATUS RVar4;
  uint uVar5;
  REF_BOOL RVar6;
  REF_INT *vector;
  ulong uVar7;
  REF_DBL *vector_00;
  REF_DBL *lengthscale;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  int iVar11;
  char *pcVar12;
  int iVar13;
  ulong uVar14;
  REF_DBL *pRVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  REF_INT bc;
  double local_1b8;
  REF_DBL local_1b0;
  REF_GRID local_1a8;
  REF_DBL local_1a0;
  REF_DBL edg_norm [3];
  REF_DBL yplus1;
  double local_168;
  double local_160;
  undefined8 local_158;
  REF_DBL local_150;
  REF_DBL RStack_148;
  REF_DBL local_140;
  double local_138;
  double local_130;
  double local_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  REF_INT edg_nodes [27];
  REF_DBL logm [6];
  REF_DBL m [6];
  
  ref_node = ref_grid->node;
  local_1b0 = mach;
  local_1a0 = target;
  RVar4 = ref_phys_minspac(re * reference_length,&yplus1);
  if (RVar4 == 0) {
    uVar14 = (ulong)(uint)ref_node->max;
    local_1a8 = ref_grid;
    if (ref_node->max < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x4a9,
             "ref_phys_yplus_metric_reference_length","malloc hits of REF_INT negative");
      return 1;
    }
    local_1b8 = yplus1;
    vector = (REF_INT *)malloc(uVar14 * 4);
    if (vector == (REF_INT *)0x0) {
      pcVar12 = "malloc hits of REF_INT NULL";
      uVar10 = 0x4a9;
    }
    else {
      local_1b8 = local_1b8 / reference_length;
      for (uVar7 = 0; uVar7 < uVar14; uVar7 = uVar7 + 1) {
        vector[uVar7] = 0;
      }
      vector_00 = (REF_DBL *)malloc(uVar14 * 0x30);
      if (vector_00 == (REF_DBL *)0x0) {
        pcVar12 = "malloc new_log_metric of REF_DBL NULL";
        uVar10 = 0x4aa;
      }
      else {
        for (uVar7 = 0; (uVar14 * 6 & 0xffffffff) != uVar7; uVar7 = uVar7 + 1) {
          vector_00[uVar7] = 0.0;
        }
        lengthscale = (REF_DBL *)malloc(uVar14 * 8);
        pRVar3 = local_1a8;
        if (lengthscale != (REF_DBL *)0x0) {
          for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
            lengthscale[uVar7] = 0.0;
          }
          RVar4 = ref_phys_yplus_lengthscale
                            (local_1a8,local_1b0,re,temperature,ldim,field,lengthscale);
          if (RVar4 == 0) {
            if (pRVar3->twod == 0) {
              RVar4 = 6;
              pcVar12 = "implement 3D";
              uVar10 = 0x4ef;
            }
            else {
              ref_cell = pRVar3->cell[0];
              local_1b0 = (REF_DBL)((ulong)local_1b0 & 0xffffffff00000000);
              for (iVar13 = 0; iVar13 < ref_cell->max; iVar13 = iVar13 + 1) {
                RVar4 = ref_cell_nodes(ref_cell,iVar13,edg_nodes);
                if (RVar4 == 0) {
                  bc = -1;
                  uVar5 = ref_dict_value(ref_dict_bcs,edg_nodes[ref_cell->node_per],&bc);
                  if ((uVar5 != 0) && (uVar5 != 5)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c"
                           ,0x4b9,"ref_phys_yplus_metric_reference_length",(ulong)uVar5,"bc");
                    local_1b0 = (REF_DBL)CONCAT44(local_1b0._4_4_,uVar5);
                  }
                  if ((uVar5 != 5) && (uVar5 != 0)) {
                    return local_1b0._0_4_;
                  }
                  RVar6 = ref_phys_wall_distance_bc(bc);
                  if (RVar6 != 0) {
                    RVar4 = ref_layer_interior_seg_normal(local_1a8,iVar13,edg_norm);
                    if (RVar4 != 0) {
                      pcVar12 = "edge norm";
                      uVar10 = 0x4bb;
                      goto LAB_001d837f;
                    }
                    local_150 = edg_norm[0];
                    RStack_148 = edg_norm[1];
                    local_140 = edg_norm[2];
                    lVar8 = (long)edg_nodes[0];
                    dVar16 = (metric[lVar8 * 6 + 5] * edg_norm[2] +
                             metric[lVar8 * 6 + 2] * edg_norm[0] +
                             edg_norm[1] * metric[lVar8 * 6 + 4]) * edg_norm[2] +
                             (metric[lVar8 * 6 + 2] * edg_norm[2] +
                             metric[lVar8 * 6] * edg_norm[0] + edg_norm[1] * metric[lVar8 * 6 + 1])
                             * edg_norm[0] +
                             (metric[lVar8 * 6 + 4] * edg_norm[2] +
                             metric[lVar8 * 6 + 1] * edg_norm[0] +
                             metric[lVar8 * 6 + 3] * edg_norm[1]) * edg_norm[1];
                    if (dVar16 < 0.0) {
                      dVar16 = sqrt(dVar16);
                    }
                    else {
                      dVar16 = SQRT(dVar16);
                    }
                    lVar8 = (long)edg_nodes[1];
                    dVar17 = (metric[lVar8 * 6 + 5] * edg_norm[2] +
                             metric[lVar8 * 6 + 2] * edg_norm[0] +
                             edg_norm[1] * metric[lVar8 * 6 + 4]) * edg_norm[2] +
                             (metric[lVar8 * 6 + 2] * edg_norm[2] +
                             metric[lVar8 * 6] * edg_norm[0] + metric[lVar8 * 6 + 1] * edg_norm[1])
                             * edg_norm[0] +
                             (metric[lVar8 * 6 + 4] * edg_norm[2] +
                             metric[lVar8 * 6 + 1] * edg_norm[0] +
                             metric[lVar8 * 6 + 3] * edg_norm[1]) * edg_norm[1];
                    if (dVar17 < 0.0) {
                      dVar17 = sqrt(dVar17);
                    }
                    else {
                      dVar17 = SQRT(dVar17);
                    }
                    lVar8 = (long)edg_nodes[0];
                    dVar19 = (lengthscale[lVar8] + lengthscale[edg_nodes[1]]) * 0.5;
                    dVar18 = dVar19 - local_1b8;
                    if (dVar18 <= -dVar18) {
                      dVar18 = -dVar18;
                    }
                    if (local_1b8 <= dVar19) {
                      dVar19 = local_1b8;
                    }
                    dVar18 = dVar18 / local_1b8 + -0.1;
                    if (dVar18 <= 0.0) {
                      dVar18 = 0.0;
                    }
                    dVar18 = dVar18 / 0.1;
                    if (1.0 <= dVar18) {
                      dVar18 = 1.0;
                    }
                    dVar16 = dVar18 * (1.0 / ((dVar16 + dVar17) * 0.5)) +
                             (1.0 - dVar18) * ((dVar19 * local_1a0) / 0.866025403784439);
                    local_168 = 1.0 / (dVar16 * dVar16);
                    local_120 = 0;
                    uStack_118 = 0;
                    local_110 = 0x3ff0000000000000;
                    local_158 = 0x3ff0000000000000;
                    local_130 = local_150 - local_140 * 0.0;
                    local_138 = local_140 * 0.0 - RStack_148;
                    local_128 = RStack_148 * 0.0 + local_150 * -0.0;
                    dVar16 = (metric[lVar8 * 6 + 5] * local_128 +
                             local_138 * metric[lVar8 * 6 + 2] + local_130 * metric[lVar8 * 6 + 4])
                             * local_128 +
                             (metric[lVar8 * 6 + 2] * local_128 +
                             metric[lVar8 * 6] * local_138 + local_130 * metric[lVar8 * 6 + 1]) *
                             local_138 +
                             (metric[lVar8 * 6 + 4] * local_128 +
                             metric[lVar8 * 6 + 1] * local_138 + metric[lVar8 * 6 + 3] * local_130)
                             * local_130;
                    if (dVar16 < 0.0) {
                      dVar16 = sqrt(dVar16);
                    }
                    else {
                      dVar16 = SQRT(dVar16);
                    }
                    lVar8 = (long)edg_nodes[1];
                    dVar17 = (metric[lVar8 * 6 + 5] * local_128 +
                             metric[lVar8 * 6 + 2] * local_138 + local_130 * metric[lVar8 * 6 + 4])
                             * local_128 +
                             (metric[lVar8 * 6 + 2] * local_128 +
                             metric[lVar8 * 6] * local_138 + metric[lVar8 * 6 + 1] * local_130) *
                             local_138 +
                             (metric[lVar8 * 6 + 4] * local_128 +
                             metric[lVar8 * 6 + 1] * local_138 + metric[lVar8 * 6 + 3] * local_130)
                             * local_130;
                    if (dVar17 < 0.0) {
                      dVar17 = sqrt(dVar17);
                    }
                    else {
                      dVar17 = SQRT(dVar17);
                    }
                    dVar16 = 1.0 / ((dVar16 + dVar17) * 0.5);
                    local_160 = 1.0 / (dVar16 * dVar16);
                    RVar4 = ref_matrix_form_m(&local_168,m);
                    if (RVar4 != 0) {
                      pcVar12 = "form";
                      uVar10 = 0x4e3;
                      goto LAB_001d837f;
                    }
                    RVar4 = ref_matrix_log_m(m,logm);
                    if (RVar4 != 0) {
                      pcVar12 = "form";
                      uVar10 = 0x4e4;
                      goto LAB_001d837f;
                    }
                    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
                      vector_00[edg_nodes[0] * 6 + lVar8] =
                           logm[lVar8] + vector_00[edg_nodes[0] * 6 + lVar8];
                    }
                    vector[edg_nodes[0]] = vector[edg_nodes[0]] + 1;
                    for (lVar8 = 0; lVar8 != 6; lVar8 = lVar8 + 1) {
                      vector_00[edg_nodes[1] * 6 + lVar8] =
                           logm[lVar8] + vector_00[edg_nodes[1] * 6 + lVar8];
                    }
                    vector[edg_nodes[1]] = vector[edg_nodes[1]] + 1;
                  }
                }
              }
              RVar4 = ref_node_ghost_dbl(ref_node,vector_00,6);
              if (RVar4 == 0) {
                RVar4 = ref_node_ghost_int(ref_node,vector,1);
                if (RVar4 == 0) {
                  pRVar15 = vector_00;
                  for (lVar8 = 0; lVar8 < ref_node->max; lVar8 = lVar8 + 1) {
                    if ((-1 < ref_node->global[lVar8]) && (iVar13 = vector[lVar8], 0 < iVar13)) {
                      for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                        pRVar15[lVar9] = pRVar15[lVar9] / (double)iVar13;
                      }
                      vector[lVar8] = -1;
                      RVar4 = ref_matrix_exp_m(vector_00 + lVar8 * 6,metric + lVar8 * 6);
                      if (RVar4 != 0) {
                        pcVar12 = "form";
                        uVar10 = 0x4fc;
                        goto LAB_001d837f;
                      }
                    }
                    pRVar15 = pRVar15 + 6;
                  }
                  RVar4 = ref_edge_create((REF_EDGE *)edg_nodes,local_1a8);
                  if (RVar4 == 0) {
                    ref_edge = (REF_EDGE)CONCAT44(edg_nodes[1],edg_nodes[0]);
                    for (lVar8 = 0; lVar8 < ref_edge->n; lVar8 = lVar8 + 1) {
                      iVar13 = ref_edge->e2n[lVar8 * 2];
                      iVar1 = ref_edge->e2n[lVar8 * 2 + 1];
                      iVar11 = vector[iVar13];
                      if ((-1 < iVar11) && (vector[iVar1] == -1)) {
                        for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                          vector_00[iVar13 * 6 + lVar9] =
                               vector_00[iVar1 * 6 + lVar9] + vector_00[iVar13 * 6 + lVar9];
                        }
                        iVar11 = iVar11 + 1;
                        vector[iVar13] = iVar11;
                      }
                      iVar2 = vector[iVar1];
                      if ((-1 < iVar2) && (iVar11 == -1)) {
                        for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                          vector_00[iVar1 * 6 + lVar9] =
                               vector_00[iVar13 * 6 + lVar9] + vector_00[iVar1 * 6 + lVar9];
                        }
                        vector[iVar1] = iVar2 + 1;
                      }
                    }
                    ref_edge_free(ref_edge);
                    RVar4 = ref_node_ghost_dbl(ref_node,vector_00,6);
                    if (RVar4 == 0) {
                      RVar4 = ref_node_ghost_int(ref_node,vector,1);
                      if (RVar4 == 0) {
                        pRVar15 = vector_00;
                        for (lVar8 = 0; lVar8 < ref_node->max; lVar8 = lVar8 + 1) {
                          if ((-1 < ref_node->global[lVar8]) && (iVar13 = vector[lVar8], 0 < iVar13)
                             ) {
                            for (lVar9 = 0; lVar9 != 6; lVar9 = lVar9 + 1) {
                              pRVar15[lVar9] = pRVar15[lVar9] / (double)iVar13;
                            }
                            vector[lVar8] = -2;
                            RVar4 = ref_matrix_exp_m(vector_00 + lVar8 * 6,metric + lVar8 * 6);
                            if (RVar4 != 0) {
                              pcVar12 = "form";
                              uVar10 = 0x521;
                              goto LAB_001d837f;
                            }
                          }
                          pRVar15 = pRVar15 + 6;
                        }
                        RVar4 = ref_node_ghost_dbl(ref_node,metric,6);
                        if (RVar4 == 0) {
                          free(lengthscale);
                          free(vector_00);
                          free(vector);
                          return 0;
                        }
                        pcVar12 = "ghost metric";
                        uVar10 = 0x525;
                      }
                      else {
                        pcVar12 = "ghost hits";
                        uVar10 = 0x518;
                      }
                    }
                    else {
                      pcVar12 = "ghost metric";
                      uVar10 = 0x517;
                    }
                  }
                  else {
                    pcVar12 = "orig edges";
                    uVar10 = 0x503;
                  }
                }
                else {
                  pcVar12 = "ghost hits";
                  uVar10 = 0x4f3;
                }
              }
              else {
                pcVar12 = "ghost metric";
                uVar10 = 0x4f2;
              }
            }
          }
          else {
            pcVar12 = "length scale";
            uVar10 = 0x4ae;
          }
          goto LAB_001d837f;
        }
        pcVar12 = "malloc lengthscale of REF_DBL NULL";
        uVar10 = 0x4ab;
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
           "ref_phys_yplus_metric_reference_length",pcVar12);
    RVar4 = 2;
  }
  else {
    pcVar12 = "minspac";
    RVar4 = 1;
    uVar10 = 0x4a6;
LAB_001d837f:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
           "ref_phys_yplus_metric_reference_length",RVar4,pcVar12);
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_phys_yplus_metric_reference_length(
    REF_GRID ref_grid, REF_DBL *metric, REF_DBL mach, REF_DBL re,
    REF_DBL temperature, REF_DBL target, REF_DBL reference_length, REF_INT ldim,
    REF_DBL *field, REF_DICT ref_dict_bcs) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL *lengthscale, *new_log_metric;
  REF_INT *hits;
  REF_INT node, i;
  REF_DBL reynolds_number, reference_lengthscale, yplus1;
  REF_DBL equilateral_altitude =
      0.866025403784439; /* sqrt(3.0)/2 altitude of equalateral triangle */

  reynolds_number = re * reference_length;
  RSS(ref_phys_minspac(reynolds_number, &yplus1), "minspac");
  reference_lengthscale = yplus1 / reference_length;

  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  ref_malloc_init(new_log_metric, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lengthscale, ref_node_max(ref_node), REF_DBL, 0.0);
  RSS(ref_phys_yplus_lengthscale(ref_grid, mach, re, temperature, ldim, field,
                                 lengthscale),
      "length scale");
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_INT bc;
    REF_INT edg, edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_DBL edg_norm[3], h, mh, l0, diff, h0, h1, ratio;
    REF_DBL d[12], m[6], logm[6];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      bc = REF_EMPTY;
      RXS(ref_dict_value(ref_dict_bcs, edg_nodes[ref_cell_id_index(edg_cell)],
                         &bc),
          REF_NOT_FOUND, "bc");
      if (!ref_phys_wall_distance_bc(bc)) continue;
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      ref_matrix_vec(d, 0, 0) = edg_norm[0];
      ref_matrix_vec(d, 1, 0) = edg_norm[1];
      ref_matrix_vec(d, 2, 0) = edg_norm[2];
      ratio =
          0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]), edg_norm) +
                 ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]), edg_norm));
      mh = 1.0 / ratio;

      l0 = 0.5 * (lengthscale[edg_nodes[0]] + lengthscale[edg_nodes[1]]);

      diff = ABS(l0 - reference_lengthscale) / reference_lengthscale;

      h0 = target * MIN(l0, reference_lengthscale) / equilateral_altitude;
      {
        REF_DBL st, sr;
        sr = MIN(MAX(diff - 0.1, 0.0) / 0.1, 1.0);
        st = 1.0 - sr;
        h = st * h0 + sr * mh;
        /*
        printf("x %.2f l0 %0.5e ref %0.5e diff %.2f sr %.2f st %.2f\n",
               ref_node_xyz(ref_node, 0, edg_nodes[0]), l0,
               reference_lengthscale, diff, sr, st);
        */
      }
      ref_matrix_eig(d, 0) = 1.0 / (h * h);

      ref_matrix_vec(d, 0, 2) = 0.0;
      ref_matrix_vec(d, 1, 2) = 0.0;
      ref_matrix_vec(d, 2, 2) = 1.0;
      ref_matrix_eig(d, 2) = 1.0;

      ref_math_cross_product(ref_matrix_vec_ptr(d, 2), ref_matrix_vec_ptr(d, 0),
                             ref_matrix_vec_ptr(d, 1));
      ratio = 0.5 * (ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[0]]),
                                            ref_matrix_vec_ptr(d, 1)) +
                     ref_matrix_sqrt_vt_m_v(&(metric[6 * edg_nodes[1]]),
                                            ref_matrix_vec_ptr(d, 1)));
      h1 = 1.0 / ratio;
      ref_matrix_eig(d, 1) = 1.0 / (h1 * h1);
      RSS(ref_matrix_form_m(d, m), "form");
      RSS(ref_matrix_log_m(m, logm), "form");
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[0]] += logm[i];
      }
      hits[edg_nodes[0]] += 1;
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * edg_nodes[1]] += logm[i];
      }
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -1;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  {
    REF_EDGE ref_edge;
    REF_INT edge, node0, node1;
    RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
    for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
      node0 = ref_edge_e2n(ref_edge, 0, edge);
      node1 = ref_edge_e2n(ref_edge, 1, edge);
      if (0 <= hits[node0] && -1 == hits[node1]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node0] += new_log_metric[i + 6 * node1];
        }
        hits[node0] += 1;
      }
      if (0 <= hits[node1] && -1 == hits[node0]) {
        for (i = 0; i < 6; i++) {
          new_log_metric[i + 6 * node1] += new_log_metric[i + 6 * node0];
        }
        hits[node1] += 1;
      }
    }
    ref_edge_free(ref_edge);
  }

  RSS(ref_node_ghost_dbl(ref_node, new_log_metric, 6), "ghost metric");
  RSS(ref_node_ghost_int(ref_node, hits, 1), "ghost hits");

  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      for (i = 0; i < 6; i++) {
        new_log_metric[i + 6 * node] /= (REF_DBL)hits[node];
      }
      hits[node] = -2;
      RSS(ref_matrix_exp_m(&(new_log_metric[6 * node]), &(metric[6 * node])),
          "form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, metric, 6), "ghost metric");

  ref_free(lengthscale);
  ref_free(new_log_metric);
  ref_free(hits);
  return REF_SUCCESS;
}